

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O2

MPP_RET hal_h264e_vepu541_gen_regs(void *hal,HalEncTask *task)

{
  MppBuffer *buffer;
  MppBufferGroup *group;
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  EncRcTask *pEVar5;
  EncRcTask *pEVar6;
  MppDev pvVar7;
  MppPacket s;
  MppFrame frame;
  HalBufs bufs;
  MppEncROICfg *roi;
  short sVar8;
  byte bVar9;
  MPP_RET MVar10;
  uint uVar11;
  MppFrameFormat MVar12;
  RK_U32 RVar13;
  RK_U32 RVar14;
  RK_U32 offset;
  RK_S32 RVar15;
  int iVar16;
  MppEncROICfg2 *cfg;
  VepuRgb2YuvCfg *pVVar17;
  MppBuffer pvVar18;
  size_t sVar19;
  size_t sVar20;
  HalBuf *pHVar21;
  HalBuf *pHVar22;
  MppBufferGroup group_00;
  void *pvVar23;
  long lVar24;
  MppEncROIRegion *region;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  undefined4 uVar31;
  long lVar32;
  undefined4 uVar33;
  RK_U32 *pRVar34;
  RK_U16 RVar35;
  uint uVar36;
  int w;
  RK_U32 *pRVar37;
  MppBuffer pvVar38;
  ulong uVar39;
  RK_U32 offset_00;
  short sVar40;
  int iVar41;
  int iVar42;
  bool bVar43;
  byte bVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  long lStackY_d0;
  H264eRplmo rplmo;
  uint local_68;
  uint *local_60;
  uint *local_58;
  
  bVar44 = 0;
  lVar2 = *hal;
  piVar3 = *(int **)((long)hal + 0x38);
  lVar24 = *(long *)((long)hal + 0x40);
  lVar4 = *(long *)((long)hal + 0x48);
  pEVar5 = task->rc_task;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_gen_regs",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","frame %d generate regs now","hal_h264e_vepu541_gen_regs",
               (ulong)**(uint **)((long)hal + 0x50));
  }
  RVar13 = hal_h264e_debug;
  uVar11 = 0;
  memset((void *)((long)hal + 0x1b8),0,0x348);
  iVar30 = *(int *)((long)hal + 0x10);
  if ((RVar13 & 2) == 0) {
    uVar25 = 0x50100;
    uVar27 = 0xff;
    uVar28 = 0x8007000;
    bVar43 = true;
    uVar36 = 0;
    uVar26 = 0;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_normal");
    uVar11 = *(uint *)((long)hal + 0x1f8);
    uVar25 = *(uint *)((long)hal + 0x1bc) & 0xfff8fc00 | 0x50100;
    uVar26 = *(uint *)((long)hal + 0x1c0) & 0xfffffffc;
    uVar36 = *(uint *)((long)hal + 0x1cc) & 0xfffffe00;
    uVar27 = *(uint *)((long)hal + 0x1c8) & 0xfffffe00 | 0xff;
    uVar28 = *(uint *)((long)hal + 500) & 0xf0000001 | 0x8007000;
    bVar43 = (hal_h264e_debug & 2) == 0;
  }
  *(uint *)((long)hal + 0x1bc) = uVar25;
  *(uint *)((long)hal + 0x1c0) = uVar26;
  *(undefined4 *)((long)hal + 0x1c4) = 0;
  *(uint *)((long)hal + 0x1c8) = uVar27;
  *(uint *)((long)hal + 0x1cc) = uVar36;
  *(undefined4 *)((long)hal + 0x1f0) = 0;
  *(uint *)((long)hal + 500) = uVar28;
  uVar25 = 0xff00ff7f;
  if (iVar30 == 0) {
    uVar25 = 0xffffff00;
  }
  *(uint *)((long)hal + 0x1f8) = uVar25 & uVar11 | 0x80;
  if (!bVar43) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_normal");
  }
  lVar32 = *hal;
  MVar12 = *(MppFrameFormat *)(lVar32 + 0x24);
  MVar10 = vepu541_set_fmt((VepuFmtCfg *)&rplmo,MVar12);
  RVar15 = rplmo.modification_of_pic_nums_idc;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_prep");
  }
  if (MVar10 != MPP_OK) {
    return MVar10;
  }
  uVar25 = (*(int *)(lVar32 + 0xc) + 0xfU >> 3 & 0x1fe) - 1 & 0x1ff;
  uVar11 = *(uint *)((long)hal + 0x1e8);
  *(uint *)((long)hal + 0x1e8) = uVar11 & 0xfffffe00 | uVar25;
  uVar26 = ((*(int *)(lVar32 + 0xc) + 0xfU & 0x30) - *(int *)(lVar32 + 0xc) & 0x3f) << 10;
  *(uint *)((long)hal + 0x1e8) = uVar11 & 0xffff0200 | uVar25 | uVar26;
  uVar27 = (*(int *)(lVar32 + 0x10) * 0x2000 + 0x1e000U & 0x1fe0000) + 0x1ff0000 & 0x1ff0000;
  *(uint *)((long)hal + 0x1e8) = uVar11 & 0xfe000200 | uVar25 | uVar26 | uVar27;
  *(uint *)((long)hal + 0x1e8) =
       uVar11 & 0x2000200 | uVar25 | uVar26 | uVar27 |
       ((*(int *)(lVar32 + 0x10) + 0xfU & 0x30) - *(int *)(lVar32 + 0x10)) * 0x4000000;
  *(uint *)((long)hal + 500) = *(uint *)((long)hal + 500) & 0xffffff0f | (local_68 & 0xf) << 4;
  *(uint *)((long)hal + 0x1fc) =
       ((uint)(MVar12 == MPP_FMT_YUV400) * 0x80 + (RVar15 & 0xfU) * 4 |
        *(uint *)((long)hal + 0x1fc) & 0xffffff00 | rplmo.abs_diff_pic_num_minus1 & 1U) +
       (rplmo.long_term_pic_idx & 1U) * 2 | (rplmo.abs_diff_view_idx_minus1 & 1U) << 6;
  if ((MVar12 & 0xf00000) == MPP_FMT_YUV420SP) {
    uVar11 = *(uint *)(lVar32 + 0x14);
    if (uVar11 == 0) {
      uVar11 = *(uint *)(lVar32 + 0xc);
    }
  }
  else {
    uVar11 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (uVar11 == 0) {
      uVar11 = *(int *)(lVar32 + 0x14) + 0xfU & 0xfffffff0;
    }
  }
  uVar25 = (int)uVar11 / 2;
  if ((RVar15 & 0xfffffffdU) == 4) {
    uVar25 = uVar11;
  }
  if ((uint)RVar15 < 3) {
    pVVar17 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar32 + 0x34),
                              *(MppFrameColorSpace *)(lVar32 + 0x28));
    bVar43 = true;
    if ((hal_h264e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","input color range %d colorspace %d","setup_vepu541_prep",
                 (ulong)*(uint *)(lVar32 + 0x34),(ulong)*(uint *)(lVar32 + 0x28));
      bVar43 = (hal_h264e_debug & 4) == 0;
    }
    uVar27 = (ushort)(pVVar17->_2y).b_coeff & 0x1ff;
    uVar26 = *(uint *)((long)hal + 0x200);
    *(uint *)((long)hal + 0x200) = uVar26 & 0xfffffe00 | uVar27;
    uVar36 = ((ushort)(pVVar17->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x200) = uVar26 & 0xfffc0000 | uVar27 | uVar36;
    *(uint *)((long)hal + 0x200) =
         uVar26 & 0xf8000000 | uVar27 | uVar36 | ((ushort)(pVVar17->_2y).r_coeff & 0x1ff) << 0x12;
    uVar27 = (ushort)(pVVar17->_2u).b_coeff & 0x1ff;
    uVar26 = *(uint *)((long)hal + 0x204);
    *(uint *)((long)hal + 0x204) = uVar26 & 0xfffffe00 | uVar27;
    uVar36 = ((ushort)(pVVar17->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x204) = uVar26 & 0xfffc0000 | uVar27 | uVar36;
    *(uint *)((long)hal + 0x204) =
         uVar26 & 0xf8000000 | uVar27 | uVar36 | ((ushort)(pVVar17->_2u).r_coeff & 0x1ff) << 0x12;
    uVar26 = *(uint *)((long)hal + 0x208);
    uVar27 = (ushort)(pVVar17->_2v).b_coeff & 0x1ff;
    *(uint *)((long)hal + 0x208) = uVar26 & 0xfffffe00 | uVar27;
    uVar36 = ((ushort)(pVVar17->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x208) = uVar26 & 0xfffc0000 | uVar27 | uVar36;
    *(uint *)((long)hal + 0x208) =
         uVar26 & 0xf8000000 | uVar27 | uVar36 | ((ushort)(pVVar17->_2v).r_coeff & 0x1ff) << 0x12;
    uVar26 = *(uint *)((long)hal + 0x20c);
    uVar27 = ((ushort)(pVVar17->_2y).offset & 0x1f) << 0x10;
    *(uint *)((long)hal + 0x20c) = uVar26 & 0xffe0ffff | uVar27;
    uVar26 = uVar26 & 0xffe000ff | uVar27 | ((ushort)(pVVar17->_2u).offset & 0xff) << 8;
    *(uint *)((long)hal + 0x20c) = uVar26;
    *(uint *)((long)hal + 0x20c) = CONCAT31((int3)(uVar26 >> 8),(char)(pVVar17->_2v).offset);
    if (!bVar43) {
      _mpp_log_l(4,"hal_h264e_vepu541","use color range %d colorspace %d","setup_vepu541_prep",
                 (ulong)pVVar17->dst_range,(ulong)pVVar17->color);
    }
  }
  else {
    uVar27 = *local_60 & 0x1ff;
    uVar26 = *(uint *)((long)hal + 0x200);
    *(uint *)((long)hal + 0x200) = uVar26 & 0xfffffe00 | uVar27;
    uVar36 = (local_60[1] & 0x1ff) << 9;
    *(uint *)((long)hal + 0x200) = uVar26 & 0xfffc0000 | uVar27 | uVar36;
    *(uint *)((long)hal + 0x200) =
         uVar26 & 0xf8000000 | uVar27 | uVar36 | (local_60[2] & 0x1ff) << 0x12;
    uVar27 = local_60[3] & 0x1ff;
    uVar26 = *(uint *)((long)hal + 0x204);
    *(uint *)((long)hal + 0x204) = uVar26 & 0xfffffe00 | uVar27;
    uVar36 = (local_60[4] & 0x1ff) << 9;
    *(uint *)((long)hal + 0x204) = uVar26 & 0xfffc0000 | uVar27 | uVar36;
    *(uint *)((long)hal + 0x204) =
         uVar26 & 0xf8000000 | uVar27 | uVar36 | (local_60[5] & 0x1ff) << 0x12;
    uVar27 = local_60[6] & 0x1ff;
    uVar26 = *(uint *)((long)hal + 0x208);
    *(uint *)((long)hal + 0x208) = uVar26 & 0xfffffe00 | uVar27;
    uVar36 = (local_60[7] & 0x1ff) << 9;
    *(uint *)((long)hal + 0x208) = uVar26 & 0xfffc0000 | uVar27 | uVar36;
    *(uint *)((long)hal + 0x208) =
         uVar26 & 0xf8000000 | uVar27 | uVar36 | (local_60[8] & 0x1ff) << 0x12;
    uVar27 = (*local_58 & 0x1f) << 0x10;
    uVar26 = *(uint *)((long)hal + 0x20c);
    *(uint *)((long)hal + 0x20c) = uVar26 & 0xffe0ffff | uVar27;
    uVar26 = uVar26 & 0xffe000ff | uVar27 | (local_58[1] & 0xff) << 8;
    *(uint *)((long)hal + 0x20c) = uVar26;
    *(uint *)((long)hal + 0x20c) = CONCAT31((int3)(uVar26 >> 8),(char)local_58[2]);
  }
  uVar26 = *(uint *)((long)hal + 0x210);
  uVar27 = (uint)((MVar12 & 0xf00000) != MPP_FMT_YUV420SP) << 0x1e;
  *(uint *)((long)hal + 0x210) = uVar26 & 0xbfffffff | uVar27;
  *(uint *)((long)hal + 0x2cc) = uVar25 << 0x10 | uVar11 & 0xffff;
  uVar11 = (uint)(0 < *(int *)(lVar32 + 0x58)) << 0x1a;
  *(uint *)((long)hal + 0x210) = uVar26 & 0xbbffffff | uVar27 | uVar11;
  *(uint *)((long)hal + 0x210) =
       (uVar26 & 0x83ffffff | uVar27 | uVar11) + (*(uint *)(lVar32 + 0x50) & 3) * 0x8000000 +
       0x20000000;
  *(byte *)((long)hal + 0x217) = *(byte *)((long)hal + 0x217) | 0x80;
  *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xe000e000;
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_prep"), (hal_h264e_debug & 2) != 0))
  {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_codec");
  }
  uVar11 = *(uint *)((long)hal + 0x1ec);
  uVar25 = *(uint *)((long)hal + 0x354);
  *(uint *)((long)hal + 0x1ec) = uVar11 & 0xfffffffe;
  uVar11 = (uVar11 & 0xffffffea) + (uint)(0 < *(int *)(lVar4 + 0x20)) * 4 + 0x10;
  *(uint *)((long)hal + 0x1ec) = uVar11;
  *(uint *)((long)hal + 0x1ec) = uVar11 & 0x7f7fffde | (uint)(*(int *)(lVar4 + 0x2c) != 2) << 5;
  uVar11 = *(uint *)(lVar4 + 0x20) & 3;
  *(uint *)((long)hal + 0x354) = uVar25 & 0xfffffffc | uVar11;
  *(uint *)((long)hal + 0x354) =
       (uVar25 & 0xffffff80 | uVar11) + (*(uint *)(lVar4 + 0x24) & 0x1f) * 4;
  uVar11 = *(uint *)((long)hal + 0x358);
  uVar25 = piVar3[10] & 0xf;
  *(uint *)((long)hal + 0x358) = uVar11 & 0xfffffff0 | uVar25;
  uVar26 = (piVar3[0x12] & 1U) << 4;
  *(uint *)((long)hal + 0x358) = uVar11 & 0xffffffe0 | uVar25 | uVar26;
  *(uint *)((long)hal + 0x358) = uVar11 & 0xfffffe00 | uVar25 | uVar26 | (piVar3[0xc] & 0xfU) << 5;
  uVar11 = *(uint *)((long)hal + 0x35c);
  uVar25 = *(uint *)(lVar24 + 8) & 1;
  *(uint *)((long)hal + 0x35c) = uVar11 & 0xfffffffe | uVar25;
  uVar11 = (uVar11 & 0xfffffffc | uVar25) + (*(uint *)(lVar24 + 0x44) & 1) * 2;
  *(uint *)((long)hal + 0x35c) = uVar11;
  uVar11 = (uVar11 & 0xfffffffb) + (*(uint *)(lVar24 + 0x3c) & 1) * 4;
  *(uint *)((long)hal + 0x35c) = uVar11;
  uVar25 = *(int *)(lVar24 + 0x14) * 8 + 0x18U & 0x18;
  *(uint *)((long)hal + 0x35c) = uVar11 & 0xffffffe7 | uVar25;
  uVar26 = *(int *)(lVar24 + 0x18) * 0x20 + 0x60U & 0x60;
  *(uint *)((long)hal + 0x35c) = uVar11 & 0xffffff87 | uVar25 | uVar26;
  uVar27 = (*(uint *)(lVar24 + 0x24) & 0x3f) << 7;
  *(uint *)((long)hal + 0x35c) = uVar11 & 0xffffe007 | uVar25 | uVar26 | uVar27;
  uVar36 = (*(uint *)(lVar24 + 0x2c) & 0x1f) << 0xd;
  *(uint *)((long)hal + 0x35c) = uVar11 & 0xfffc0007 | uVar25 | uVar26 | uVar27 | uVar36;
  uVar28 = (*(uint *)(lVar24 + 0x34) & 0x1f) << 0x12;
  *(uint *)((long)hal + 0x35c) = uVar11 & 0xff800007 | uVar25 | uVar26 | uVar27 | uVar36 | uVar28;
  uVar29 = (*(uint *)(lVar24 + 0x1c) & 1) << 0x17;
  *(uint *)((long)hal + 0x35c) =
       uVar11 & 0xff000007 | uVar25 | uVar26 | uVar27 | uVar36 | uVar28 | uVar29;
  *(uint *)((long)hal + 0x35c) =
       uVar11 & 0xfe000007 | uVar25 | uVar26 | uVar27 | uVar36 | uVar28 | uVar29 |
       (*(uint *)(lVar24 + 0x38) & 1) << 0x18;
  uVar11 = (*(uint *)((long)hal + 0x360) & 0xfffffffc) + (uint)(*(int *)(lVar4 + 0x2c) == 2) * 2;
  *(uint *)((long)hal + 0x360) = uVar11;
  uVar11 = (uVar11 & 0xfffff802) + (*(uint *)(lVar4 + 0x30) & 0xff) * 4;
  *(uint *)((long)hal + 0x360) = uVar11;
  uVar25 = (*(uint *)(lVar4 + 0x38) & 1) << 0xb;
  *(uint *)((long)hal + 0x360) = uVar11 & 0xfffff3fe | uVar25;
  uVar26 = (*(uint *)(lVar4 + 0x40) & 3) << 0xc;
  *(uint *)((long)hal + 0x360) = uVar11 & 0xffffc3fe | uVar25 | uVar26;
  *(uint *)((long)hal + 0x360) = uVar11 & 0xc3fe | uVar25 | uVar26 | *(int *)(lVar4 + 0x34) << 0x10;
  uVar11 = 0xffff;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar11 = (uint)*(ushort *)(lVar4 + 0x6c);
  }
  *(short *)((long)hal + 0x364) = (short)uVar11;
  *(uint *)((long)hal + 0x364) = *(int *)(lVar4 + 0x74) << 0x10 | uVar11;
  uVar25 = (*(uint *)(lVar4 + 0x44) & 3) << 0xb;
  uVar11 = *(uint *)((long)hal + 0x368);
  *(uint *)((long)hal + 0x368) = uVar11 & 0xffffe7ff | uVar25;
  *(uint *)((long)hal + 0x368) = uVar11 & 0xffffe07f | uVar25 | (*(uint *)(lVar4 + 0x48) & 0xf) << 7
  ;
  h264e_reorder_rd_rewind(*(H264eReorderInfo **)(lVar4 + 0x58));
  MVar10 = h264e_reorder_rd_op(*(H264eReorderInfo **)(lVar4 + 0x58),&rplmo);
  if (MVar10 == MPP_OK) {
    uVar11 = (rplmo.modification_of_pic_nums_idc & 3U) + (*(uint *)((long)hal + 0x368) & 0xfffffff8)
             + 4;
    *(uint *)((long)hal + 0x368) = uVar11;
    RVar15 = rplmo.abs_diff_pic_num_minus1;
    if (((uint)rplmo.modification_of_pic_nums_idc < 2) ||
       (RVar15 = rplmo.long_term_pic_idx, rplmo.modification_of_pic_nums_idc == 2)) {
      *(uint *)((long)hal + 0x368) = uVar11 & 0xffff | RVar15 << 0x10;
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu541","invalid modification_of_pic_nums_idc %d\n",
                 "setup_vepu541_codec");
    }
  }
  else {
    *(uint *)((long)hal + 0x368) = *(uint *)((long)hal + 0x368) & 0xfff8;
  }
  *(uint *)((long)hal + 0x36c) = *(uint *)((long)hal + 0x36c) & 0xe0000000;
  *(undefined4 *)((long)hal + 0x370) = 0;
  *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffff000;
  h264e_marking_rd_rewind(*(H264eMarkingInfo **)(lVar4 + 0x60));
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar11 = *(uint *)((long)hal + 0x36c);
    uVar25 = *(uint *)(lVar4 + 0x7c) & 1;
    *(uint *)((long)hal + 0x36c) = uVar11 & 0xfffffffe | uVar25;
    *(uint *)((long)hal + 0x36c) =
         (uVar11 & 0xfffffffc | uVar25) + (*(uint *)(lVar4 + 0x80) & 1) * 2;
  }
  else {
    RVar15 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
    if (RVar15 == 0) {
      *(byte *)((long)hal + 0x36c) = *(byte *)((long)hal + 0x36c) | 4;
      h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&rplmo);
      uVar26 = 0;
      uVar11 = 0;
      uVar25 = rplmo.abs_diff_pic_num_minus1;
      switch(rplmo.modification_of_pic_nums_idc) {
      case 1:
        uVar27 = 0x10;
        break;
      case 2:
        uVar27 = 0x20;
        uVar25 = rplmo.long_term_pic_idx;
        break;
      case 3:
        uVar11 = rplmo.abs_diff_view_idx_minus1 & 0xf;
        uVar27 = 0x30;
        break;
      case 4:
        uVar27 = 0x40;
        uVar11 = uVar26;
        uVar25 = local_68;
        break;
      case 5:
        uVar27 = 0x50;
        uVar25 = 0;
        uVar11 = uVar26;
        break;
      case 6:
        uVar27 = 0x60;
        uVar11 = uVar26;
        uVar25 = rplmo.abs_diff_view_idx_minus1;
        break;
      default:
        uVar27 = 0;
        _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
        uVar11 = 0;
        uVar25 = 0;
      }
      *(uint *)((long)hal + 0x36c) =
           (uVar25 & 0xffff) << 7 | uVar27 | *(uint *)((long)hal + 0x36c) & 0xff80000f;
      *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffffff0 | uVar11;
      RVar15 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
      if (RVar15 == 0) {
        h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&rplmo);
        uVar25 = 0;
        uVar11 = 0;
        switch(rplmo.modification_of_pic_nums_idc) {
        case 1:
          uVar26 = rplmo.abs_diff_pic_num_minus1 & 0xffff;
          uVar33 = 0x800000;
          break;
        case 2:
          uVar26 = rplmo.long_term_pic_idx & 0xffff;
          uVar33 = 0x1000000;
          break;
        case 3:
          uVar26 = rplmo.abs_diff_pic_num_minus1 & 0xffff;
          uVar11 = (rplmo.abs_diff_view_idx_minus1 & 0xfU) << 4;
          uVar33 = 0x1800000;
          break;
        case 4:
          uVar26 = local_68 & 0xffff;
          uVar33 = 0x2000000;
          uVar11 = uVar25;
          break;
        case 5:
          uVar33 = 0x2800000;
          uVar26 = 0;
          uVar11 = uVar25;
          break;
        case 6:
          uVar26 = rplmo.abs_diff_view_idx_minus1 & 0xffff;
          uVar33 = 0x3000000;
          uVar11 = uVar25;
          break;
        default:
          uVar33 = 0;
          _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
          uVar26 = 0;
          uVar11 = 0;
        }
        *(ulong *)((long)hal + 0x36c) =
             CONCAT44(uVar26,uVar33) | *(ulong *)((long)hal + 0x36c) & (ulong)DAT_0029e8f0;
        *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xffffff0f | uVar11;
        RVar15 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
        if (RVar15 == 0) {
          h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&rplmo);
          uVar25 = 0;
          uVar11 = 0;
          switch(rplmo.modification_of_pic_nums_idc) {
          case 1:
            uVar33 = 0x4000000;
            rplmo.abs_diff_view_idx_minus1 = rplmo.abs_diff_pic_num_minus1;
            break;
          case 2:
            uVar33 = 0x8000000;
            rplmo.abs_diff_view_idx_minus1 = rplmo.long_term_pic_idx;
            break;
          case 3:
            uVar11 = (rplmo.abs_diff_view_idx_minus1 & 0xfU) << 8;
            uVar33 = 0xc000000;
            rplmo.abs_diff_view_idx_minus1 = rplmo.abs_diff_pic_num_minus1;
            break;
          case 4:
            uVar33 = 0x10000000;
            uVar11 = uVar25;
            rplmo.abs_diff_view_idx_minus1 = local_68;
            break;
          case 5:
            uVar33 = 0x14000000;
            rplmo.abs_diff_view_idx_minus1 = 0;
            uVar11 = uVar25;
            break;
          case 6:
            uVar33 = 0x18000000;
            uVar11 = uVar25;
            break;
          default:
            uVar33 = 0;
            _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
            rplmo.abs_diff_view_idx_minus1 = 0;
            uVar11 = 0;
          }
          *(ulong *)((long)hal + 0x36c) =
               CONCAT44(rplmo.abs_diff_view_idx_minus1 << 0x10,uVar33) |
               *(ulong *)((long)hal + 0x36c) & (ulong)DAT_0029e900;
          *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffff0ff | uVar11;
        }
      }
    }
  }
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_codec"), (hal_h264e_debug & 2) != 0)
     ) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_rdo_pred");
  }
  bVar9 = *(byte *)((long)hal + 0x21c) & 0xf8;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    *(byte *)((long)hal + 0x21c) = bVar9;
LAB_002111ef:
    pRVar34 = h264e_klut_weight;
  }
  else {
    *(byte *)((long)hal + 0x21c) = bVar9 | 3;
    if (*(int *)(lVar2 + 0x1864) != 1) goto LAB_002111ef;
    pRVar34 = h264e_klut_weight + 3;
  }
  pRVar37 = (RK_U32 *)((long)hal + 0x220);
  for (lVar32 = 0x18; lVar32 != 0; lVar32 = lVar32 + -1) {
    *pRVar37 = *pRVar34;
    pRVar34 = pRVar34 + (ulong)bVar44 * -2 + 1;
    pRVar37 = pRVar37 + (ulong)bVar44 * -2 + 1;
  }
  bVar43 = *(int *)(lVar2 + 0x1864) == 1;
  uVar11 = 0x9c509c5;
  if (bVar43) {
    uVar11 = 0x3f0009;
  }
  uVar25 = 0x80300;
  if (!bVar43) {
    uVar25 = 2;
  }
  *(uint *)((long)hal + 0x34c) = uVar11 | *(uint *)((long)hal + 0x34c) & 0xf000f000;
  uVar11 = *(uint *)((long)hal + 0x350);
  *(uint *)((long)hal + 0x350) = uVar11 & 0xfff7e01d | uVar25;
  iVar30 = 0;
  uVar26 = 0;
  if (*piVar3 == 0x42) {
    uVar26 = (uint)(piVar3[7] < 0x1f);
  }
  *(uint *)((long)hal + 0x350) = uVar11 & 0xfff7e01c | uVar25 | uVar26;
  if (*piVar3 < 0x4d) {
    iVar30 = (uint)(*(int *)(lVar24 + 8) == 0) << 3;
  }
  uVar11 = (uVar11 & 0xfff7c004 | uVar25 | uVar26) + iVar30 + 0x2010;
  *(uint *)((long)hal + 0x350) = uVar11;
  uVar25 = (*(uint *)(lVar24 + 0x48) & 1) << 0xe;
  *(uint *)((long)hal + 0x350) = uVar11 & 0xffffa31f | uVar25;
  *(uint *)((long)hal + 0x350) =
       (uVar11 & 0x7fc8231f | uVar25) + (*(uint *)(lVar24 + 0x48) & 3) * 0x100000 + 0x8000;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_rdo_pred");
  }
  pEVar6 = task->rc_task;
  iVar30 = piVar3[0xf];
  uVar11 = (pEVar6->info).bit_target;
  uVar25 = (pEVar6->info).quality_target;
  uVar26 = (pEVar6->info).quality_min;
  uVar27 = (pEVar6->info).quality_max;
  iVar41 = (int)(uVar11 << 4) / (piVar3[0x10] * iVar30);
  if ((hal_h264e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","bittarget %d qp [%d %d %d]\n","setup_vepu541_rc_base",
               (ulong)uVar11,(ulong)uVar26,uVar25,uVar27);
  }
  iVar42 = 0x50000;
  if (iVar41 < 0x100000) {
    iVar42 = iVar41;
  }
  iVar41 = ((iVar42 * iVar30 >> 4) * 5) / 0x10;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_rc_base");
  }
  *(uint *)((long)hal + 0x1ec) = *(uint *)((long)hal + 0x1ec) & 0xffffc0ff | (uVar25 & 0x3f) << 8;
  *(uint *)((long)hal + 0x280) = (*(uint *)((long)hal + 0x280) & 0xfff8) + iVar30 * 0x10000 + 3;
  uVar27 = uVar27 & 0x3f;
  uVar11 = uVar26 & 0x3f;
  *(uint *)((long)hal + 0x284) =
       uVar26 << 0x1a |
       uVar27 << 0x14 |
       (*(uint *)(lVar2 + 0x17c + (ulong)(*(int *)(lVar4 + 0x2c) == 2) * 4) & 0xf) << 0x10 |
       (uint)*(ushort *)((long)hal + 0x284);
  *(ulong *)((long)hal + 0x288) =
       CONCAT44(0x2083fe,iVar42) & 0xffffffff000fffff |
       *(ulong *)((long)hal + 0x288) & 0xfe000000fff00000;
  *(uint *)((long)hal + 0x290) = *(uint *)((long)hal + 0x290) & 0xfff00000;
  *(int *)((long)hal + 0x294) = iVar41 * -2;
  *(int *)((long)hal + 0x298) = -iVar41;
  *(int *)((long)hal + 0x29c) = iVar41;
  *(int *)((long)hal + 0x2a0) = iVar41 * 2;
  *(undefined8 *)((long)hal + 0x2a4) = 0x7fffffff7fffffff;
  *(undefined8 *)((long)hal + 0x2ac) = 0x7fffffff7fffffff;
  *(undefined4 *)((long)hal + 0x2b4) = 0x7fffffff;
  *(uint *)((long)hal + 0x2b8) =
       *(uint *)((long)hal + 0x2b8) & 0xc0000000 | uVar11 | uVar11 << 0xc | uVar11 << 0x18 |
       uVar27 << 6 | uVar27 << 0x12;
  *(uint *)((long)hal + 700) =
       uVar27 << 0x18 |
       uVar11 << 0x12 | uVar27 << 0xc | uVar11 << 6 | *(uint *)((long)hal + 700) & 0xc0000000 |
       uVar27;
  *(uint *)((long)hal + 0x2c0) =
       *(uint *)((long)hal + 0x2c0) & 0xc0000000 | uVar11 | uVar11 << 0xc | uVar11 << 0x18 |
       uVar27 << 6 | uVar27 << 0x12;
  *(uint *)((long)hal + 0x2c4) = (*(uint *)((long)hal + 0x2c4) & 0x3fffffc0) + uVar27 + 0x40000000;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_rc_base");
  }
  pvVar7 = *(MppDev *)((long)hal + 8);
  s = task->packet;
  frame = task->frame;
  pvVar18 = mpp_frame_get_buffer(frame);
  pvVar38 = task->output;
  MVar12 = mpp_frame_get_fmt(frame);
  RVar13 = mpp_frame_get_hor_stride(frame);
  RVar14 = mpp_frame_get_ver_stride(frame);
  iVar30 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_vepu541_io_buf");
  sVar19 = mpp_packet_get_length(s);
  sVar20 = mpp_buffer_get_size_with_caller(pvVar38,"setup_vepu541_io_buf");
  iVar41 = mpp_buffer_get_fd_with_caller(pvVar38,"setup_vepu541_io_buf");
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_io_buf");
  }
  *(int *)((long)hal + 0x2d0) = iVar30;
  *(int *)((long)hal + 0x2d4) = iVar30;
  *(int *)((long)hal + 0x2d8) = iVar30;
  *(int *)((long)hal + 0x304) = iVar41;
  *(int *)((long)hal + 0x308) = iVar41;
  *(int *)((long)hal + 0x30c) = iVar41;
  *(int *)((long)hal + 0x310) = iVar41;
  if ((MVar12 & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(frame);
    offset_00 = 0;
    goto LAB_00211710;
  }
  offset = 0;
  offset_00 = 0;
  if (MPP_FMT_AYUV1BPP < (MVar12 & 0xfffc) || (MVar12 & 0xf0000) != MPP_FMT_YUV420SP)
  goto LAB_00211710;
  vepu541_set_fmt((VepuFmtCfg *)&rplmo,MVar12);
  switch(rplmo.modification_of_pic_nums_idc) {
  case 4:
  case 6:
    offset = RVar14 * RVar13;
    offset_00 = offset;
    break;
  case 5:
    iVar30 = RVar14 * RVar13 * 3;
    iVar41 = 2;
    goto LAB_00211701;
  case 7:
    iVar30 = RVar14 * RVar13 * 5;
    iVar41 = 4;
LAB_00211701:
    offset = RVar14 * RVar13;
    offset_00 = iVar30 / iVar41;
    break;
  default:
    offset = 0;
    offset_00 = 0;
  }
LAB_00211710:
  mpp_dev_set_reg_offset(pvVar7,0x47,offset);
  mpp_dev_set_reg_offset(pvVar7,0x48,offset_00);
  mpp_dev_set_reg_offset(pvVar7,0x53,(RK_U32)sVar20);
  mpp_dev_set_reg_offset(pvVar7,0x56,(RK_U32)sVar19);
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_io_buf"), (hal_h264e_debug & 2) != 0
     )) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_roi");
  }
  if (*(undefined8 **)((long)hal + 0x160) == (undefined8 *)0x0) {
    pvVar38 = *(MppBuffer *)((long)hal + 0x180);
    if (pvVar38 != (MppBuffer)0x0) {
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      goto LAB_002117ce;
    }
    roi = *(MppEncROICfg **)((long)hal + 0x158);
    if (((roi == (MppEncROICfg *)0x0) || (roi->number == 0)) ||
       (roi->regions == (MppEncROIRegion *)0x0)) {
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) & 0xfd;
      *(undefined4 *)((long)hal + 0x2dc) = 0;
    }
    else {
      iVar30 = *(int *)(*(long *)((long)hal + 0x38) + 0x3c) << 4;
      iVar41 = *(int *)(*(long *)((long)hal + 0x38) + 0x40) << 4;
      RVar15 = vepu541_get_roi_buf_size(iVar30,iVar41);
      pvVar38 = *(MppBuffer *)((long)hal + 0x170);
      if ((pvVar38 == (MppBuffer)0x0) || (RVar15 != *(int *)((long)hal + 0x178))) {
        buffer = (MppBuffer *)((long)hal + 0x170);
        group = (MppBufferGroup *)((long)hal + 0x168);
        group_00 = *(MppBufferGroup *)((long)hal + 0x168);
        if (group_00 == (MppBufferGroup)0x0) {
          mpp_buffer_group_get
                    (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h264e_vepu541",
                     "setup_vepu541_roi");
        }
        else if (RVar15 != *(int *)((long)hal + 0x178)) {
          if (pvVar38 != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(pvVar38,"setup_vepu541_roi");
            *buffer = (MppBuffer)0x0;
            group_00 = *group;
          }
          mpp_buffer_group_clear(group_00);
        }
        if ((*group == (MppBufferGroup)0x0) &&
           (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx->roi_grp","setup_vepu541_roi",0x44e), (mpp_debug._3_1_ & 0x10) != 0))
        goto LAB_00212944;
        pvVar38 = *buffer;
        if (pvVar38 == (MppBuffer)0x0) {
          mpp_buffer_get_with_tag
                    (*(MppBufferGroup *)((long)hal + 0x168),buffer,(long)RVar15,"hal_h264e_vepu541",
                     "setup_vepu541_roi");
          pvVar38 = *(MppBuffer *)((long)hal + 0x170);
          *(RK_S32 *)((long)hal + 0x178) = RVar15;
          if (pvVar38 == (MppBuffer)0x0) {
            _mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx->roi_buf","setup_vepu541_roi",0x456);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00212944;
            pvVar38 = *buffer;
          }
        }
        else {
          *(RK_S32 *)((long)hal + 0x178) = RVar15;
        }
      }
      iVar42 = mpp_buffer_get_fd_with_caller(pvVar38,"setup_vepu541_roi");
      pvVar23 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_roi");
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      *(int *)((long)hal + 0x2dc) = iVar42;
      vepu541_set_roi(pvVar23,roi,iVar30,iVar41);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x170),0,"setup_vepu541_roi");
    }
  }
  else {
    *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
    pvVar38 = (MppBuffer)**(undefined8 **)((long)hal + 0x160);
LAB_002117ce:
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar38,"setup_vepu541_roi");
    *(int *)((long)hal + 0x2dc) = iVar30;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_roi");
  }
  pvVar7 = *(MppDev *)((long)hal + 8);
  bufs = *(HalBufs *)((long)hal + 0x18);
  lVar24 = *(long *)((long)hal + 0x50);
  RVar13 = *(RK_U32 *)((long)hal + 0x20);
  pHVar21 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar24 + 4));
  pHVar22 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar24 + 8));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_recn_refr");
  }
  if ((pHVar21 != (HalBuf *)0x0) && (pHVar21->cnt != 0)) {
    pvVar38 = *pHVar21->buf;
    pvVar18 = pHVar21->buf[1];
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar38,"setup_vepu541_recn_refr");
    if (((pvVar38 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu541_recn_refr",0x476), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar18 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu541_recn_refr",0x477), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00212944;
    *(int *)((long)hal + 0x2e0) = iVar30;
    *(int *)((long)hal + 0x2e4) = iVar30;
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_vepu541_recn_refr");
    *(int *)((long)hal + 0x2f8) = iVar30;
    mpp_dev_set_reg_offset(pvVar7,0x4b,RVar13);
  }
  if ((pHVar22 != (HalBuf *)0x0) && (pHVar22->cnt != 0)) {
    pvVar38 = *pHVar22->buf;
    pvVar18 = pHVar22->buf[1];
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar38,"setup_vepu541_recn_refr");
    if (((pvVar38 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu541_recn_refr",0x485), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar18 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu541_recn_refr",0x486), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00212944;
    *(int *)((long)hal + 0x2e8) = iVar30;
    *(int *)((long)hal + 0x2ec) = iVar30;
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_vepu541_recn_refr");
    *(int *)((long)hal + 0x2fc) = iVar30;
    mpp_dev_set_reg_offset(pvVar7,0x4d,RVar13);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_recn_refr");
  }
  if (task->md_info == (MppBuffer)0x0) {
    iVar30 = 0;
  }
  else {
    iVar30 = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu541_gen_regs");
  }
  *(int *)((long)hal + 0x300) = iVar30;
  RVar13 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xffffe000 | RVar13 & 0x1fff;
  RVar13 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)hal + 0x2c8) =
       *(uint *)((long)hal + 0x2c8) & 0xe000ffff | (RVar13 & 0x1fff) << 0x10;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_split");
  }
  iVar30 = *(int *)(lVar2 + 0xe94);
  if (iVar30 == 2) {
    uVar11 = *(uint *)((long)hal + 0x314);
    *(uint *)((long)hal + 0x314) = uVar11 & 0xffffc000 | 0x2fa3;
    *(uint *)((long)hal + 0x314) =
         (uVar11 & 0xc000 | 0x2fa3) + *(int *)(lVar2 + 0xe98) * 0x10000 + -0x10000;
    *(uint *)((long)hal + 0x318) = *(uint *)((long)hal + 0x318) & 0xfffc0000;
LAB_00211b9e:
    *(byte *)((long)hal + 0x1ef) = *(byte *)((long)hal + 0x1ef) & 0xbf;
  }
  else {
    if (iVar30 == 1) {
      *(uint *)((long)hal + 0x314) = *(uint *)((long)hal + 0x314) & 0xc000 | 0x2fa1;
      *(uint *)((long)hal + 0x318) =
           *(uint *)((long)hal + 0x318) & 0xfffc0000 | *(uint *)(lVar2 + 0xe98) & 0x3ffff;
      goto LAB_00211b9e;
    }
    if (iVar30 == 0) {
      *(ulong *)((long)hal + 0x314) = *(ulong *)((long)hal + 0x314) & 0xfffc00000000c000;
      goto LAB_00211b9e;
    }
    _mpp_log_l(4,"hal_h264e_vepu541","invalide slice split mode %d\n","setup_vepu541_split");
  }
  *(undefined4 *)(lVar2 + 0xe90) = 0;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_split");
  }
  if (*(int *)((long)hal + 0x10) == 0) {
    bVar43 = true;
  }
  else {
    iVar30 = *(int *)(lVar2 + 0xc);
    if (0x780 < iVar30) {
      bVar43 = true;
      if ((hal_h264e_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu540_force_slice_split");
        bVar43 = (hal_h264e_debug & 2) == 0;
      }
      *(uint *)((long)hal + 0x314) =
           (*(uint *)((long)hal + 0x314) & 0xc000) + (iVar30 * 0x1000 - 0x1000U & 0xffff0000) +
           0x2fa3;
      *(uint *)((long)hal + 0x318) = *(uint *)((long)hal + 0x318) & 0xfffc0000;
      *(byte *)((long)hal + 0x1ef) = *(byte *)((long)hal + 0x1ef) & 0xbf;
      *(byte *)((long)hal + 0x217) = *(byte *)((long)hal + 0x217) & 0x7f;
      if (!bVar43) {
        _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu540_force_slice_split");
      }
    }
    bVar43 = *(int *)((long)hal + 0x10) == 0;
  }
  iVar30 = piVar3[7];
  iVar41 = piVar3[0xf];
  iVar42 = (iVar41 * 0x10 + 0x3f) / 0x40;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_me");
  }
  if ((iVar30 - 0xbU < 3) || ((uVar11 = 0xc, iVar30 != 10 && (iVar30 != 99)))) {
    uVar11 = 0x1c;
  }
  iVar30 = piVar3[0xf] * 2 + 1;
  if (iVar30 < 0x2c) {
    uVar25 = iVar30 / 4 & 0xf;
  }
  else {
    uVar25 = 0xb;
  }
  uVar27 = uVar11 >> 2;
  iVar30 = (int)((long)((long)(piVar3[0x10] * 0x10 + 0x3f) & 0xffffffffffffffc0U) / 0x80);
  uVar26 = iVar30 << 4;
  if (uVar27 == iVar30 * 4 || SBORROW4(uVar27,iVar30 * 4) != (int)(uVar27 + iVar30 * -4) < 0) {
    uVar26 = uVar11;
  }
  uVar26 = uVar26 << 2;
  *(uint *)((long)hal + 0x31c) =
       uVar25 + (uVar26 & 0xf0 | *(uint *)((long)hal + 0x31c) & 0xc000) + 0x2f00;
  uVar11 = *(uint *)((long)hal + 800) | 0x505;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar11 = *(uint *)((long)hal + 800) & 0xfff00000;
  }
  *(uint *)((long)hal + 800) = uVar11 & 0xfff00505 | 0xa0000;
  if (bVar43) {
    if (iVar41 < 0xe1) {
      if (iVar41 < 0xc5) {
        if (iVar41 < 0xb1) {
          if (iVar41 < 0xa1) {
            if (iVar41 < 0x95) {
              if (iVar41 < 0x89) {
                if (iVar41 < 0x81) {
                  if (iVar41 < 0x75) {
                    uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff;
                    if (iVar41 < 0x71) {
                      uVar11 = uVar11 | 0x8800;
                    }
                    else {
                      uVar11 = uVar11 | 0x8000;
                    }
                  }
                  else {
                    uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x7800;
                  }
                }
                else {
                  uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x7000;
                }
              }
              else {
                uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x6800;
              }
            }
            else {
              uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x6000;
            }
          }
          else {
            uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x5800;
          }
        }
        else {
          uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x5000;
        }
      }
      else {
        uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x4800;
      }
    }
    else {
      uVar11 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x4000;
    }
    uVar26 = uVar26 >> 3 & 0x1e;
    uVar25 = uVar25 * 4 + 0xf >> 3 | 1;
    uVar27 = uVar11 >> 0xb & 0x1f;
    if (uVar26 + 1 < uVar27) {
      uVar11 = uVar11 & 0xfffff800 | uVar26 * iVar42 + uVar25 & 0x7ff;
    }
    else {
      uVar11 = uVar11 & 0xfffff800 | (uVar27 - 1) * iVar42 + uVar25 & 0x7ff;
    }
    *(uint *)((long)hal + 0x324) = uVar11;
  }
  else {
    uVar36 = (*(uint *)((long)hal + 0x1e8) & 0x1ff) * 8 + 0x47 >> 6;
    iVar41 = uVar36 * -4 + 0x1f8;
    iVar30 = uVar36 * 4 + -0x1c;
    uVar11 = 0x1dc;
    uVar27 = 0;
    do {
      uVar28 = uVar27;
      uVar27 = uVar28 + 1;
      iVar41 = iVar41 + iVar30;
      if (0x10 < uVar27) break;
      bVar43 = uVar11 < 0x510;
      uVar11 = uVar11 + iVar30;
    } while (bVar43);
    if (iVar41 < 0x511) {
      uVar28 = uVar27;
    }
    uVar27 = uVar25 + 3 >> 1 | 1;
    uVar25 = uVar26 >> 3 & 0x1e;
    uVar11 = uVar25 + 1;
    if (uVar28 <= uVar25) {
      uVar11 = uVar28;
    }
    uVar25 = iVar42 * 2;
    if ((int)uVar27 <= iVar42) {
      uVar25 = uVar27;
    }
    *(uint *)((long)hal + 0x324) =
         (uVar11 - 1) * iVar42 + uVar25 & 0x7ff |
         (uVar28 & 0x1f) << 0xb | uVar36 << 0x12 | *(uint *)((long)hal + 0x324) & 0xfc030000;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_me");
  }
  uVar39 = (pEVar5->frm).val;
  if ((uVar39 >> 0x26 & 1) != 0) {
    lVar32 = (long)(uVar39 >> 0x30) % (long)*(int *)(lVar2 + 0xc4);
    iVar41 = (int)lVar32;
    lVar24 = *hal;
    uVar11 = *(uint *)(*(long *)((long)hal + 0x38) + 0x3c);
    uVar25 = *(uint *)(*(long *)((long)hal + 0x38) + 0x40);
    iVar30 = *(int *)(lVar24 + 0x16c);
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_intra_refresh");
      lVar24 = *hal;
    }
    if (*(int *)(lVar24 + 0x164) == 0) {
      uVar39 = 0xfffffffffffffffa;
    }
    else {
      w = uVar11 << 4;
      iVar42 = uVar25 << 4;
      RVar15 = vepu541_get_roi_buf_size(w,iVar42);
      if (*(int *)((long)hal + 0x178) < RVar15) {
        if (*(long *)((long)hal + 0x168) == 0) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)((long)hal + 0x168),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_h264e_vepu541","setup_vepu541_intra_refresh");
        }
        if (*(MppBuffer *)((long)hal + 0x170) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller
                    (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
        }
        mpp_buffer_get_with_tag
                  (*(MppBufferGroup *)((long)hal + 0x168),(MppBuffer *)((long)hal + 0x170),
                   (long)RVar15,"hal_h264e_vepu541","setup_vepu541_intra_refresh");
        *(RK_S32 *)((long)hal + 0x178) = RVar15;
      }
      pvVar38 = *(MppBuffer *)((long)hal + 0x170);
      if (pvVar38 == (MppBuffer)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->roi_buf"
                   ,"setup_vepu541_intra_refresh",0x3ed);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00212944:
          abort();
        }
        pvVar38 = *(MppBuffer *)((long)hal + 0x170);
      }
      iVar16 = mpp_buffer_get_fd_with_caller(pvVar38,"setup_vepu541_intra_refresh");
      pvVar23 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
      for (lVar24 = 0;
          ((uVar25 & 0xfffffff) + 3 & 0xfffffffc) * ((uVar11 & 0xfffffff) + 3 & 0xfffffffc) !=
          (int)lVar24; lVar24 = lVar24 + 1) {
        *(undefined2 *)((long)pvVar23 + lVar24 * 2) = 0x80;
      }
      region = (MppEncROIRegion *)mpp_osal_calloc("setup_vepu541_intra_refresh",0x10);
      uVar39 = 0;
      if (region == (MppEncROIRegion *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu541","Failed to calloc for MppEncROIRegion !\n",
                   "setup_vepu541_intra_refresh");
        uVar39 = 0xfffffffffffffffc;
      }
      lVar24 = *hal;
      iVar1 = *(int *)(lVar24 + 0x168);
      sVar40 = (short)lVar32;
      sVar8 = (short)iVar30;
      if (iVar1 == 1) {
        region->y = 0;
        region->h = (RK_U16)iVar42;
        if (iVar41 == 0) {
          sVar40 = (short)(iVar30 << 4);
          RVar35 = 0;
        }
        else {
          RVar35 = sVar40 * sVar8 * 0x10 - 0x20;
          sVar40 = sVar8 * 0x10 + 0x20;
        }
        region->x = RVar35;
        uVar11 = 1;
        uVar25 = 0xfffffff0;
        lStackY_d0 = 4;
LAB_0021249b:
        *(short *)((long)&region->x + lStackY_d0) = sVar40;
        *(uint *)((long)hal + 0x31c) = uVar25 & *(uint *)((long)hal + 0x31c) | uVar11;
      }
      else if (iVar1 == 0) {
        region->x = 0;
        region->w = (RK_U16)w;
        if (iVar41 == 0) {
          sVar40 = (short)(iVar30 << 4);
          RVar35 = 0;
        }
        else {
          RVar35 = sVar40 * sVar8 * 0x10 - 0x20;
          sVar40 = sVar8 * 0x10 + 0x20;
        }
        uVar11 = 0x10;
        region->y = RVar35;
        uVar25 = 0xffffff0f;
        lStackY_d0 = 6;
        goto LAB_0021249b;
      }
      region->intra = 1;
      region->quality = -*(short *)(lVar24 + 0x124);
      region->qp_area_idx = 1;
      region->area_map_en = '\x01';
      region->abs_qp_en = '\0';
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      *(int *)((long)hal + 0x2dc) = iVar16;
      vepu541_set_one_roi(pvVar23,region,w,iVar42);
      mpp_osal_free("setup_vepu541_intra_refresh",region);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x170),0,"setup_vepu541_intra_refresh");
    }
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","leave, ret %d\n","setup_vepu541_intra_refresh",
                 uVar39 & 0xffffffff);
    }
  }
  if (*(int *)((long)hal + 0x10) == 0) {
    vepu541_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
  }
  else {
    vepu540_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_l2");
  }
  memset((void *)((long)hal + 0x518),0,0x2f4);
  *(undefined8 *)((long)hal + 0x500) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x508) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x510) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x51c) = 0x30283c3030283c30;
  *(undefined8 *)((long)hal + 0x524) = 0x201c2a2430283c30;
  if (*(int *)(lVar2 + 0x1864) == 1) {
    *(undefined4 *)((long)hal + 0x518) = 0;
    *(undefined4 *)((long)hal + 0x800) = 3;
    if (*(int *)(lVar4 + 0x2c) != 2) {
      uVar45 = 0x171b1c00000051;
      uVar46 = 0x171b1c00202020;
LAB_0021263e:
      *(undefined8 *)((long)hal + 0x534) = uVar45;
      *(undefined8 *)((long)hal + 0x53c) = uVar46;
      uVar31 = 0x2ae47;
      uVar33 = 0x2d0051;
      goto LAB_0021264f;
    }
    uVar45 = 0x10121400202020;
  }
  else {
    *(undefined4 *)((long)hal + 0x518) = 0x9c5;
    *(undefined4 *)((long)hal + 0x800) = 0;
    if (*(int *)(lVar4 + 0x2c) != 2) {
      *(undefined4 *)((long)hal + 0x52c) = 0x247;
      uVar45 = 0x10111200000051;
      uVar46 = 0x10111200141414;
      goto LAB_0021263e;
    }
    uVar45 = 0x10121400141414;
  }
  *(undefined8 *)((long)hal + 0x534) = 0x10101000000024;
  *(undefined8 *)((long)hal + 0x53c) = uVar45;
  uVar31 = 0x2aeab;
  uVar33 = 0x2d0024;
LAB_0021264f:
  *(undefined4 *)((long)hal + 0x52c) = uVar31;
  if (*(int *)(lVar2 + 0x18c) != 0) {
    uVar11 = *(uint *)(lVar2 + 0x184) & 0x3ff;
    *(uint *)((long)hal + 0x52c) = uVar11 + 0x2ac00;
    *(uint *)((long)hal + 0x52c) = (*(uint *)(lVar2 + 0x188) & 0x3ff) << 10 | uVar11;
  }
  *(undefined4 *)((long)hal + 0x530) = 0x40001;
  *(undefined4 *)((long)hal + 0x534) = uVar33;
  *(undefined8 *)((long)hal + 0x544) = 0x9c4009000400000;
  *(undefined8 *)((long)hal + 0x54c) = 0xc0009001180050;
  *(undefined8 *)((long)hal + 0x554) = 0x1600130018001a;
  *(undefined8 *)((long)hal + 0x55c) = 0xdac0dac00130013;
  *(undefined8 *)((long)hal + 0x564) = 0x3e80dac0000;
  *(undefined4 *)((long)hal + 0x56c) = 0;
  *(undefined4 *)((long)hal + 0x638) = 0;
  memcpy((void *)((long)hal + 0x63c),h264e_lambda_default + 6,0xd0);
  memcpy((void *)((long)hal + 0x70c),h264e_lambda_default + 5,0xd0);
  *(undefined4 *)((long)hal + 0x7dc) = 0;
  ((RK_S32 *)((long)hal + 0x7e0))[0] = 0;
  ((RK_S32 *)((long)hal + 0x7e0))[1] = 0;
  ((RK_S32 *)((long)hal + 0x7e8))[0] = 0;
  ((RK_S32 *)((long)hal + 0x7e8))[1] = 0;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
      *(undefined1 *)((long)hal + lVar24 + 0x7e0) = *(undefined1 *)(lVar2 + 0x198 + lVar24 * 4);
      *(byte *)((long)hal + lVar24 + 0x7f0) = *(byte *)(lVar2 + 0x218 + lVar24 * 4) & 0x3f;
    }
  }
  else {
    for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
      *(undefined1 *)((long)hal + lVar24 + 0x7e0) = *(undefined1 *)(lVar2 + 0x1d8 + lVar24 * 4);
      *(byte *)((long)hal + lVar24 + 0x7f0) = *(byte *)(lVar2 + 600 + lVar24 * 4) & 0x3f;
    }
  }
  *(ulong *)((long)hal + 0x800) =
       *(ulong *)((long)hal + 0x800) & 0xf000f000f000003f | (ulong)DAT_0029e9c0;
  *(uint *)((long)hal + 0x808) = *(uint *)((long)hal + 0x808) & 0xfffff000 | 0x31;
  mpp_env_get_u32("dump_l2_reg",&dump_l2_reg,0);
  if (dump_l2_reg != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","L2 reg dump start:\n",(char *)0x0);
    uVar39 = 0;
    while (uVar39 != 0x30c) {
      lVar2 = uVar39 + 0x500;
      uVar39 = uVar39 + 4;
      _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,uVar39 & 0xffffffff,
                 (ulong)*(uint *)((long)hal + lVar2));
    }
    _mpp_log_l(4,"hal_h264e_vepu541","L2 reg done\n",(char *)0x0);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_l2");
  }
  mpp_env_get_u32("dump_l1_reg",&dump_l1_reg,0);
  if (dump_l1_reg != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","L1 reg dump start:\n",(char *)0x0);
    for (uVar39 = 0; uVar39 != 0x1d0; uVar39 = uVar39 + 4) {
      _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,uVar39 & 0xffffffff,
                 (ulong)*(uint *)((long)hal + 0x1b8 + uVar39));
    }
    _mpp_log_l(4,"hal_h264e_vepu541","L1 reg done\n",(char *)0x0);
  }
  *(int *)((long)hal + 0x14) = *(int *)((long)hal + 0x14) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu541_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    Vepu541H264eRegSet *regs = &ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu541_normal(regs, ctx->is_vepu540);
    ret = setup_vepu541_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu541_codec(regs, sps, pps, slice);
    setup_vepu541_rdo_pred(regs, sps, pps, slice, cfg);
    setup_vepu541_rc_base(regs, sps, slice, &cfg->hw, task->rc_task);
    setup_vepu541_io_buf(regs, ctx->dev, task);
    setup_vepu541_roi(regs, ctx);
    setup_vepu541_recn_refr(regs, ctx->dev, ctx->frms, ctx->hw_recn,
                            ctx->pixel_buf_fbc_hdr_size);

    regs->reg082.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;

    regs->reg068.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg068.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu541_split(regs, &cfg->split);
    if (ctx->is_vepu540 && prep->width > 1920)
        setup_vepu540_force_slice_split(regs, prep->width);

    setup_vepu541_me(regs, sps, slice, ctx->is_vepu540);

    if (frm_status->is_i_refresh)
        setup_vepu541_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (ctx->is_vepu540)
        vepu540_set_osd(&ctx->osd_cfg);
    else
        vepu541_set_osd(&ctx->osd_cfg);

    setup_vepu541_l2(&ctx->regs_l2_set, slice, &cfg->hw, cfg);

    mpp_env_get_u32("dump_l1_reg", &dump_l1_reg, 0);

    if (dump_l1_reg) {
        mpp_log("L1 reg dump start:\n");
        RK_U32 *p = (RK_U32 *)regs;
        RK_S32 n = 0x1D0 / sizeof(RK_U32);
        RK_S32 i;

        for (i = 0; i < n; i++)
            mpp_log("%04x %08x\n", i * 4, p[i]);

        mpp_log("L1 reg done\n");
    }

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}